

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O1

int archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  ushort uVar2;
  uint ocode;
  int iVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  if (length != 0) {
    plVar4 = (long *)f->data;
    if (*plVar4 == 0) {
      bVar1 = *buff;
      buff = (void *)((long)buff + 1);
      *(uint *)((long)plVar4 + 0x65164) = (uint)bVar1;
      *plVar4 = 1;
      length = length - 1;
    }
    if (length != 0) {
      do {
        bVar1 = *buff;
        *plVar4 = *plVar4 + 1;
        ocode = *(uint *)((long)plVar4 + 0x65164);
        iVar5 = (uint)bVar1 * 0x10000 + ocode;
        *(int *)(plVar4 + 0xca2d) = iVar5;
        uVar11 = ocode ^ (uint)bVar1 << 8;
        iVar6 = *(int *)((long)plVar4 + (long)(int)uVar11 * 4 + 0x24);
        if (iVar6 == iVar5) {
          uVar2 = *(ushort *)((long)plVar4 + (long)(int)uVar11 * 2 + 0x43648);
LAB_001708f7:
          *(uint *)((long)plVar4 + 0x65164) = (uint)uVar2;
        }
        else {
          if (-1 < iVar6) {
            iVar6 = uVar11 - 0x10d89;
            if ((uint)bVar1 << 8 == ocode) {
              iVar6 = -1;
            }
            do {
              uVar10 = uVar11 + iVar6;
              uVar11 = uVar11 + 0x10d89 + iVar6;
              if (-1 < (int)uVar10) {
                uVar11 = uVar10;
              }
              iVar3 = *(int *)((long)plVar4 + 0x24 + (long)(int)uVar11 * 4);
              if (iVar3 == iVar5) {
                uVar2 = *(ushort *)((long)plVar4 + (long)(int)uVar11 * 2 + 0x43648);
                goto LAB_001708f7;
              }
            } while (-1 < iVar3);
          }
          iVar6 = output_code(f,ocode);
          if (iVar6 != 0) {
            return iVar6;
          }
          *(uint *)((long)plVar4 + 0x65164) = (uint)bVar1;
          iVar6 = *(int *)((long)plVar4 + 0x6515c);
          if (iVar6 < (int)plVar4[4]) {
            *(int *)((long)plVar4 + 0x6515c) = iVar6 + 1;
            *(short *)((long)plVar4 + (long)(int)uVar11 * 2 + 0x43648) = (short)iVar6;
            *(int *)((long)plVar4 + (long)(int)uVar11 * 4 + 0x24) = (int)plVar4[0xca2d];
          }
          else {
            lVar7 = *plVar4;
            if (plVar4[2] <= lVar7) {
              plVar4[2] = lVar7 + 10000;
              if ((lVar7 < 0x800000) && (lVar9 = plVar4[1], lVar9 != 0)) {
                lVar7 = lVar7 << 8;
LAB_0017092b:
                iVar6 = (int)(lVar7 / lVar9);
              }
              else {
                lVar9 = plVar4[1];
                lVar8 = lVar9 + 0xff;
                if (-1 < lVar9) {
                  lVar8 = lVar9;
                }
                iVar6 = (int)((ulong)lVar8 >> 8);
                if (iVar6 != 0) {
                  lVar9 = (long)iVar6;
                  goto LAB_0017092b;
                }
                iVar6 = 0x7fffffff;
              }
              if ((int)plVar4[0xca2c] < iVar6) {
                *(int *)(plVar4 + 0xca2c) = iVar6;
              }
              else {
                *(undefined4 *)(plVar4 + 0xca2c) = 0;
                memset((void *)((long)plVar4 + 0x24),0xff,0x43624);
                *(undefined4 *)((long)plVar4 + 0x6515c) = 0x101;
                iVar6 = output_code(f,0x100);
                if (iVar6 != 0) {
                  return iVar6;
                }
              }
            }
          }
        }
        length = length - 1;
        buff = (void *)((long)buff + 1);
      } while (length != 0);
    }
  }
  return 0;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) + state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}